

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O3

int32_t get_algorithm<int>(int d)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int32_t iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int *in_RSI;
  undefined4 in_register_0000003c;
  long *plVar9;
  long lVar10;
  
  plVar9 = (long *)CONCAT44(in_register_0000003c,d);
  if (d == 0) {
    get_algorithm<int>();
    iVar5 = 0;
    if ((ulong)*(uint *)(plVar9 + 1) != 0) {
      lVar10 = 0;
      do {
        piVar1 = (int *)(*plVar9 + lVar10);
        lVar10 = lVar10 + 4;
        iVar5 = iVar5 + *piVar1 / *in_RSI;
      } while ((ulong)*(uint *)(plVar9 + 1) << 2 != lVar10);
    }
    return iVar5;
  }
  uVar6 = (ulong)(uint)-d;
  if (0 < d) {
    uVar6 = (ulong)(uint)d;
  }
  uVar4 = (uint)uVar6;
  if ((uVar4 - 1 & uVar4) != 0) {
    uVar8 = 0x1e - LZCOUNT(uVar4);
    uVar2 = (ulong)(uint)(1 << (uVar8 & 0x1f)) << 0x20;
    iVar3 = (int)(uVar2 / uVar6);
    iVar7 = (int)(uVar2 % uVar6);
    if (uVar4 - iVar7 >> ((byte)~(byte)LZCOUNT(uVar4) & 0x1f) == 0) {
      iVar5 = 2 - (uint)((uVar8 & 0x40) == 0);
    }
    else {
      iVar3 = (uint)(iVar7 < 0 || uVar4 <= (uint)(iVar7 * 2)) + iVar3 * 2;
      iVar5 = 2;
    }
    iVar7 = -2 - iVar3;
    if (d < 0) {
      iVar7 = iVar3;
    }
    if (iVar7 != -1) {
      return iVar5;
    }
  }
  return 0;
}

Assistant:

static LIBDIVIDE_INLINE struct libdivide_s32_t libdivide_internal_s32_gen(
    int32_t d, int branchfree) {
    if (d == 0) {
        LIBDIVIDE_ERROR("divider must be != 0");
    }

    struct libdivide_s32_t result;

    // If d is a power of 2, or negative a power of 2, we have to use a shift.
    // This is especially important because the magic algorithm fails for -1.
    // To check if d is a power of 2 or its inverse, it suffices to check
    // whether its absolute value has exactly one bit set. This works even for
    // INT_MIN, because abs(INT_MIN) == INT_MIN, and INT_MIN has one bit set
    // and is a power of 2.
    uint32_t ud = (uint32_t)d;
    uint32_t absD = (d < 0) ? -ud : ud;
    uint32_t floor_log_2_d = 31 - libdivide_count_leading_zeros32(absD);
    // check if exactly one bit is set,
    // don't care if absD is 0 since that's divide by zero
    if ((absD & (absD - 1)) == 0) {
        // Branchfree and normal paths are exactly the same
        result.magic = 0;
        result.more = (uint8_t)(floor_log_2_d | (d < 0 ? LIBDIVIDE_NEGATIVE_DIVISOR : 0));
    } else {
        LIBDIVIDE_ASSERT(floor_log_2_d >= 1);

        uint8_t more;
        // the dividend here is 2**(floor_log_2_d + 31), so the low 32 bit word
        // is 0 and the high word is floor_log_2_d - 1
        uint32_t rem, proposed_m;
        proposed_m = libdivide_64_div_32_to_32((uint32_t)1 << (floor_log_2_d - 1), 0, absD, &rem);
        const uint32_t e = absD - rem;

        // We are going to start with a power of floor_log_2_d - 1.
        // This works if works if e < 2**floor_log_2_d.
        if (!branchfree && e < ((uint32_t)1 << floor_log_2_d)) {
            // This power works
            more = (uint8_t)(floor_log_2_d - 1);
        } else {
            // We need to go one higher. This should not make proposed_m
            // overflow, but it will make it negative when interpreted as an
            // int32_t.
            proposed_m += proposed_m;
            const uint32_t twice_rem = rem + rem;
            if (twice_rem >= absD || twice_rem < rem) proposed_m += 1;
            more = (uint8_t)(floor_log_2_d | LIBDIVIDE_ADD_MARKER);
        }

        proposed_m += 1;
        int32_t magic = (int32_t)proposed_m;

        // Mark if we are negative. Note we only negate the magic number in the
        // branchfull case.
        if (d < 0) {
            more |= LIBDIVIDE_NEGATIVE_DIVISOR;
            if (!branchfree) {
                magic = -magic;
            }
        }

        result.more = more;
        result.magic = magic;
    }
    return result;
}